

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_format(lua_State *L)

{
  int arg;
  undefined1 auVar1 [64];
  byte bVar2;
  ushort *puVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  byte *pbVar8;
  void *pvVar9;
  ushort **ppuVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  undefined1 (*__s) [64];
  lconv *plVar14;
  undefined1 *puVar15;
  byte *pbVar16;
  byte *__src;
  int iVar17;
  size_t sVar18;
  size_t sVar19;
  bool bVar20;
  undefined1 auVar21 [64];
  lua_Number lVar22;
  size_t l;
  char form [32];
  size_t sfl;
  undefined1 (*local_20a8) [64];
  int local_209c;
  size_t local_2098;
  undefined2 local_2090;
  undefined4 local_208c;
  char local_2088 [32];
  lua_Number local_2068;
  size_t local_2060;
  size_t local_2058;
  luaL_Buffer local_2050;
  
  local_208c = lua_gettop(L);
  pbVar7 = (byte *)luaL_checklstring(L,1,&local_2058);
  luaL_buffinit(L,&local_2050);
  if (0 < (long)local_2058) {
    iVar5 = 1;
    pbVar16 = pbVar7;
    do {
      if (*pbVar16 != 0x25) {
        if (local_2050.size <= local_2050.n) {
          luaL_prepbuffsize(&local_2050,1);
        }
        pbVar8 = pbVar16 + 1;
LAB_0013eb79:
        local_2050.b[local_2050.n] = *pbVar16;
        __src = pbVar8;
        local_2050.n = local_2050.n + 1;
        goto LAB_0013ef89;
      }
      __src = pbVar16 + 1;
      if (pbVar16[1] == 0x25) {
        if (local_2050.size <= local_2050.n) {
          luaL_prepbuffsize(&local_2050,1);
        }
        pbVar8 = pbVar16 + 2;
        pbVar16 = __src;
        goto LAB_0013eb79;
      }
      local_20a8 = (undefined1 (*) [64])luaL_prepbuffsize(&local_2050,0x78);
      arg = iVar5 + 1;
      if (local_208c <= iVar5) {
        local_209c = luaL_argerror(L,arg,"no value");
        bVar20 = false;
        goto LAB_0013ef7b;
      }
      bVar2 = *__src;
      pbVar16 = __src;
      while ((bVar2 != 0 && (pvVar9 = memchr("-+ #0",(int)(char)bVar2,6), pvVar9 != (void *)0x0))) {
        bVar2 = pbVar16[1];
        pbVar16 = pbVar16 + 1;
      }
      if (5 < (ulong)((long)pbVar16 - (long)__src)) {
        luaL_error(L,"invalid format (repeated flags)");
      }
      ppuVar10 = __ctype_b_loc();
      puVar3 = *ppuVar10;
      uVar13 = (ulong)(puVar3[*pbVar16] >> 0xb & 1);
      pbVar16 = pbVar16 + ((puVar3[pbVar16[uVar13]] >> 0xb & 1) != 0) + uVar13;
      if (*pbVar16 == 0x2e) {
        bVar20 = (*(byte *)((long)puVar3 + (ulong)pbVar16[1] * 2 + 1) & 8) == 0;
        pbVar8 = pbVar16 + 2;
        if (bVar20) {
          pbVar8 = pbVar16 + 1;
        }
        pbVar16 = pbVar8 + ((puVar3[pbVar16[2 - (ulong)bVar20]] >> 0xb & 1) != 0);
      }
      if ((*(byte *)((long)puVar3 + (ulong)*pbVar16 * 2 + 1) & 8) != 0) {
        luaL_error(L,"invalid format (width or precision too long)");
      }
      local_2088[0] = '%';
      memcpy(local_2088 + 1,__src,(size_t)(pbVar16 + (1 - (long)__src)));
      pbVar16[(long)(local_2088 + (2 - (long)__src))] = 0;
      bVar2 = *pbVar16;
      __src = pbVar16 + 1;
      sVar18 = 0x78;
      if (bVar2 < 0x58) {
        if (bVar2 == 0x41) goto switchD_0013ecf1_caseD_61;
        if ((bVar2 == 0x45) || (bVar2 == 0x47)) goto switchD_0013ecf1_caseD_65;
switchD_0013ecf1_caseD_59:
        local_209c = luaL_error(L,"invalid conversion \'%s\' to \'format\'",local_2088);
LAB_0013ee1f:
        bVar20 = false;
        goto LAB_0013ef7b;
      }
      switch(bVar2) {
      case 0x58:
      case 100:
      case 0x69:
      case 0x6f:
      case 0x75:
      case 0x78:
        pcVar11 = (char *)luaL_checkinteger(L,arg);
        addlenmod(local_2088,"ll");
        auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
        auVar1 = vmovdqu64_avx512f(auVar21);
        *(undefined1 (*) [64])(*local_20a8 + 0x38) = auVar1;
        auVar1 = vmovdqu64_avx512f(auVar21);
        *local_20a8 = auVar1;
        goto LAB_0013ed41;
      default:
        goto switchD_0013ecf1_caseD_59;
      case 0x61:
switchD_0013ecf1_caseD_61:
        addlenmod(local_2088,"");
        auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
        auVar1 = vmovdqu64_avx512f(auVar21);
        *(undefined1 (*) [64])(*local_20a8 + 0x38) = auVar1;
        auVar1 = vmovdqu64_avx512f(auVar21);
        *local_20a8 = auVar1;
        luaL_checknumber(L,arg);
        iVar5 = snprintf((char *)local_20a8,0x78,local_2088);
        break;
      case 99:
        auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
        auVar1 = vmovdqu64_avx512f(auVar21);
        *(undefined1 (*) [64])(*local_20a8 + 0x38) = auVar1;
        auVar1 = vmovdqu64_avx512f(auVar21);
        *local_20a8 = auVar1;
        uVar13 = luaL_checkinteger(L,arg);
        iVar5 = snprintf((char *)local_20a8,0x78,local_2088,uVar13 & 0xffffffff);
        break;
      case 0x65:
      case 0x67:
        goto switchD_0013ecf1_caseD_65;
      case 0x66:
        local_20a8 = (undefined1 (*) [64])luaL_prepbuffsize(&local_2050,0x1a2);
        sVar18 = 0x1a2;
        goto switchD_0013ecf1_caseD_65;
      case 0x70:
        pcVar11 = (char *)lua_topointer(L,arg);
        if (pcVar11 == (char *)0x0) {
          sVar18 = strlen(local_2088);
          local_2088[sVar18 - 1] = 's';
          pcVar11 = "(null)";
        }
        auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
        auVar1 = vmovdqu64_avx512f(auVar21);
        *(undefined1 (*) [64])(*local_20a8 + 0x38) = auVar1;
        auVar1 = vmovdqu64_avx512f(auVar21);
        *local_20a8 = auVar1;
LAB_0013ed41:
        iVar5 = snprintf((char *)local_20a8,0x78,local_2088,pcVar11);
        break;
      case 0x71:
        if (local_2088[2] == '\0') {
          uVar6 = lua_type(L,arg);
          if (uVar6 < 2) {
            iVar5 = 0;
            luaL_tolstring(L,arg,(size_t *)0x0);
            luaL_addvalue(&local_2050);
            break;
          }
          if (uVar6 != 3) {
            if (uVar6 == 4) {
              pcVar11 = lua_tolstring(L,arg,&local_2060);
              sVar4 = local_2060;
              if (local_2050.size <= local_2050.n) {
                luaL_prepbuffsize(&local_2050,1);
              }
              uVar13 = local_2050.n + 1;
              local_2050.b[local_2050.n] = '\"';
              local_2050.n = uVar13;
              if (sVar4 != 0) {
                sVar19 = 0;
                do {
                  bVar2 = pcVar11[sVar19];
                  if (((bVar2 == 10) || (bVar2 == 0x5c)) || (bVar2 == 0x22)) {
                    if (local_2050.size <= local_2050.n) {
                      luaL_prepbuffsize(&local_2050,1);
                    }
                    local_2050.b[local_2050.n] = '\\';
                    local_2050.n = local_2050.n + 1;
LAB_0013f0c7:
                    if (local_2050.size <= local_2050.n) {
                      luaL_prepbuffsize(&local_2050,1);
                    }
                    local_2050.b[local_2050.n] = pcVar11[sVar19];
                    local_2050.n = local_2050.n + 1;
                  }
                  else {
                    if (((*ppuVar10)[bVar2] & 2) == 0) goto LAB_0013f0c7;
                    local_2098 = 0xabababababababab;
                    local_2090 = 0xabab;
                    pcVar12 = "\\%d";
                    if (((*ppuVar10)[(byte)pcVar11[sVar19 + 1]] >> 0xb & 1) != 0) {
                      pcVar12 = "\\%03d";
                    }
                    snprintf((char *)&local_2098,10,pcVar12);
                    luaL_addstring(&local_2050,(char *)&local_2098);
                  }
                  sVar19 = sVar19 + 1;
                } while (sVar4 != sVar19);
              }
              if (local_2050.size <= local_2050.n) {
                luaL_prepbuffsize(&local_2050,1);
              }
              local_2050.b[local_2050.n] = '\"';
              local_2050.n = local_2050.n + 1;
            }
            else {
              luaL_argerror(L,arg,"value has no literal form");
            }
            goto LAB_0013ee9b;
          }
          __s = (undefined1 (*) [64])luaL_prepbuffsize(&local_2050,0x78);
          iVar5 = lua_isinteger(L,arg);
          if (iVar5 == 0) {
            lVar22 = lua_tonumberx(L,arg,(int *)0x0);
            pcVar11 = "1e9999";
            if (((INFINITY <= lVar22) || (pcVar11 = "-1e9999", lVar22 <= -INFINITY)) ||
               (pcVar11 = "(0/0)", NAN(lVar22))) {
              auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
              auVar1 = vmovdqu64_avx512f(auVar21);
              *(undefined1 (*) [64])(*__s + 0x38) = auVar1;
              auVar1 = vmovdqu64_avx512f(auVar21);
              *__s = auVar1;
              pcVar12 = "%s";
              goto LAB_0013f2ed;
            }
            auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
            auVar1 = vmovdqu64_avx512f(auVar21);
            *(undefined1 (*) [64])(*__s + 0x38) = auVar1;
            auVar1 = vmovdqu64_avx512f(auVar21);
            *__s = auVar1;
            iVar5 = snprintf((char *)__s,0x78,"%a","(0/0)");
            pvVar9 = memchr(__s,0x2e,(long)iVar5);
            if (pvVar9 == (void *)0x0) {
              plVar14 = localeconv();
              puVar15 = (undefined1 *)memchr(__s,(int)*plVar14->decimal_point,(long)iVar5);
              if (puVar15 != (undefined1 *)0x0) {
                *puVar15 = 0x2e;
              }
            }
          }
          else {
            pcVar11 = (char *)lua_tointegerx(L,arg,(int *)0x0);
            pcVar12 = "%lld";
            auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
            auVar1 = vmovdqu64_avx512f(auVar21);
            *__s = auVar1;
            auVar1 = vmovdqu64_avx512f(auVar21);
            *(undefined1 (*) [64])(*__s + 0x38) = auVar1;
LAB_0013f2ed:
            iVar5 = snprintf((char *)__s,0x78,pcVar12,pcVar11);
          }
          local_2050.n = local_2050.n + (long)iVar5;
          goto LAB_0013ee9b;
        }
        local_209c = luaL_error(L,"specifier \'%%q\' cannot have modifiers");
        goto LAB_0013ee1f;
      case 0x73:
        pcVar11 = luaL_tolstring(L,arg,&local_2098);
        sVar4 = local_2098;
        if (local_2088[2] != '\0') {
          sVar18 = strlen(pcVar11);
          if (sVar4 != sVar18) {
            luaL_argerror(L,arg,"string contains zeros");
          }
          pcVar12 = strchr(local_2088,0x2e);
          if ((pcVar12 != (char *)0x0) || (local_2098 < 100)) {
            auVar21 = vpbroadcastb_avx512bw(ZEXT116(0xab));
            auVar1 = vmovdqu64_avx512f(auVar21);
            *(undefined1 (*) [64])(*local_20a8 + 0x38) = auVar1;
            auVar1 = vmovdqu64_avx512f(auVar21);
            *local_20a8 = auVar1;
            iVar5 = snprintf((char *)local_20a8,0x78,local_2088,pcVar11);
            lua_settop(L,-2);
            break;
          }
        }
        luaL_addvalue(&local_2050);
LAB_0013ee9b:
        iVar5 = 0;
      }
      iVar17 = 0x78;
LAB_0013ef67:
      if (iVar17 <= iVar5) {
        __assert_fail("nb < maxitem",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstrlib.c"
                      ,0x51d,"int str_format(lua_State *)");
      }
      local_2050.n = local_2050.n + (long)iVar5;
      bVar20 = true;
LAB_0013ef7b:
      iVar5 = arg;
      if (!bVar20) {
        return local_209c;
      }
LAB_0013ef89:
      pbVar16 = __src;
    } while (__src < pbVar7 + local_2058);
  }
  luaL_pushresult(&local_2050);
  return 1;
switchD_0013ecf1_caseD_65:
  local_2068 = luaL_checknumber(L,arg);
  addlenmod(local_2088,"");
  iVar17 = (int)sVar18;
  memset(local_20a8,0xab,sVar18);
  iVar5 = snprintf((char *)local_20a8,sVar18,local_2088,local_2068);
  goto LAB_0013ef67;
}

Assistant:

static int str_format (lua_State *L) {
  int top = lua_gettop(L);
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format ('%...') */
      int maxitem = MAX_ITEM;
      char *buff = luaL_prepbuffsize(&b, maxitem);  /* to put formatted item */
      int nb = 0;  /* number of bytes in added item */
      if (++arg > top)
        return luaL_argerror(L, arg, "no value");
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          nb = l_sprintf(buff, maxitem, form, (int)luaL_checkinteger(L, arg));
          break;
        }
        case 'd': case 'i':
        case 'o': case 'u': case 'x': case 'X': {
          lua_Integer n = luaL_checkinteger(L, arg);
          addlenmod(form, LUA_INTEGER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACINT)n);
          break;
        }
        case 'a': case 'A':
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = lua_number2strx(L, buff, maxitem, form,
                                  luaL_checknumber(L, arg));
          break;
        case 'f':
          maxitem = MAX_ITEMF;  /* extra space for '%f' */
          buff = luaL_prepbuffsize(&b, maxitem);
          /* FALLTHROUGH */
        case 'e': case 'E': case 'g': case 'G': {
          lua_Number n = luaL_checknumber(L, arg);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACNUMBER)n);
          break;
        }
        case 'p': {
          const void *p = lua_topointer(L, arg);
          if (p == NULL) {  /* avoid calling 'printf' with argument NULL */
            p = "(null)";  /* result */
            form[strlen(form) - 1] = 's';  /* format it as a string */
          }
          nb = l_sprintf(buff, maxitem, form, p);
          break;
        }
        case 'q': {
          if (form[2] != '\0')  /* modifiers? */
            return luaL_error(L, "specifier '%%q' cannot have modifiers");
          addliteral(L, &b, arg);
          break;
        }
        case 's': {
          size_t l;
          const char *s = luaL_tolstring(L, arg, &l);
          if (form[2] == '\0')  /* no modifiers? */
            luaL_addvalue(&b);  /* keep entire string */
          else {
            luaL_argcheck(L, l == strlen(s), arg, "string contains zeros");
            if (!strchr(form, '.') && l >= 100) {
              /* no precision and string is too long to be formatted */
              luaL_addvalue(&b);  /* keep entire string */
            }
            else {  /* format the string into 'buff' */
              nb = l_sprintf(buff, maxitem, form, s);
              lua_pop(L, 1);  /* remove result from 'luaL_tolstring' */
            }
          }
          break;
        }
        default: {  /* also treat cases 'pnLlh' */
          return luaL_error(L, "invalid conversion '%s' to 'format'", form);
        }
      }
      lua_assert(nb < maxitem);
      luaL_addsize(&b, nb);
    }
  }
  luaL_pushresult(&b);
  return 1;
}